

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O1

ostream * operator<<(ostream *strm,Employee *obj)

{
  ostream *poVar1;
  
  poVar1 = operator<<((ostream *)&std::cout,&obj->super_Person);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"hourWork: ",10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)strm,obj->hourWork);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nsalaryPerHour: ",0x10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,obj->salaryPerHour);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nworkToDo: ",0xb);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,obj->workToDo);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nworkDone: ",0xb);
  std::ostream::operator<<((ostream *)poVar1,obj->workDone);
  return strm;
}

Assistant:

ostream &operator<<(ostream &strm, const Employee &obj) {
    cout << static_cast<const Person &>(obj) << endl;
    strm << "hourWork: " << obj.hourWork << "\nsalaryPerHour: " << obj.salaryPerHour << "\nworkToDo: " <<
         obj.workToDo << "\nworkDone: " << obj.workDone;
    return strm;
}